

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::table(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
        *this,size_t num_buckets,hasher *hf,key_equal *eq,node_allocator *a)

{
  unsigned_long uVar1;
  
  (this->super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>).current_ = false;
  uVar1 = mix64_policy<unsigned_long>::new_bucket_count(num_buckets);
  this->bucket_count_ = uVar1;
  this->size_ = 0;
  this->mlf_ = 1.0;
  this->max_load_ = 0;
  this->buckets_ = (bucket_pointer)0x0;
  return;
}

Assistant:

table(std::size_t num_buckets,
                hasher const& hf,
                key_equal const& eq,
                node_allocator const& a) :
            functions(hf, eq),
            allocators_(a,a),
            bucket_count_(policy::new_bucket_count(num_buckets)),
            size_(0),
            mlf_(1.0f),
            max_load_(0),
            buckets_()
        {}